

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator_ext_dma.c
# Opt level: O3

MPP_RET allocator_ext_dma_mmap(void *ctx,MppBufferInfo *info)

{
  uint uVar1;
  undefined8 in_RAX;
  void *pvVar2;
  MPP_RET MVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  
  uVar5 = (undefined4)((ulong)in_RAX >> 0x20);
  if (ctx == (void *)0x0) {
    uVar4 = CONCAT44(uVar5,0x5d);
    _mpp_log_l(2,(char *)0x0,"Assertion %s failed at %s:%d\n",(char *)0x0,"ctx",
               "allocator_ext_dma_mmap",uVar4);
    uVar5 = (undefined4)((ulong)uVar4 >> 0x20);
    if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_0011d208;
  }
  if (info->size == 0) {
    uVar4 = CONCAT44(uVar5,0x5e);
    _mpp_log_l(2,(char *)0x0,"Assertion %s failed at %s:%d\n",(char *)0x0,"info->size",
               "allocator_ext_dma_mmap",uVar4);
    uVar5 = (undefined4)((ulong)uVar4 >> 0x20);
    if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_0011d208;
  }
  if (info->fd < 0) {
    _mpp_log_l(2,(char *)0x0,"Assertion %s failed at %s:%d\n",(char *)0x0,"info->fd >= 0",
               "allocator_ext_dma_mmap",CONCAT44(uVar5,0x5f));
    if ((mpp_debug._3_1_ & 0x10) != 0) {
LAB_0011d208:
      abort();
    }
  }
  MVar3 = MPP_OK;
  if (info->ptr == (void *)0x0) {
    MVar3 = MPP_OK;
    uVar1 = fcntl64(info->fd,3);
    pvVar2 = mmap64((void *)0x0,info->size,(uVar1 & 2) + 1,1,info->fd,0);
    if (pvVar2 == (void *)0xffffffffffffffff) {
      MVar3 = MPP_ERR_NULL_PTR;
    }
    else {
      info->ptr = pvVar2;
    }
  }
  return MVar3;
}

Assistant:

static MPP_RET allocator_ext_dma_mmap(void *ctx, MppBufferInfo *info)
{
    void *ptr = NULL;
    int flags = 0;
    unsigned long offset = 0L;
    mpp_assert(ctx);
    mpp_assert(info->size);
    mpp_assert(info->fd >= 0);

    if (info->ptr)
        return MPP_OK;

    /*
     * It is insecure to access the first memory page,
     * usually system doesn't allow this behavior.
     */
    flags = PROT_READ;
    if (fcntl(info->fd, F_GETFL) & O_RDWR)
        flags |= PROT_WRITE;

    ptr = mmap(NULL, info->size, flags, MAP_SHARED, info->fd, offset);
    if (ptr == MAP_FAILED)
        return MPP_ERR_NULL_PTR;

    info->ptr = ptr;

    return MPP_OK;
}